

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-read-stop.c
# Opt level: O3

void timer_cb(uv_timer_t *handle)

{
  int iVar1;
  uv_timer_t *in_RSI;
  
  if (handle == &timer) {
    uv_walk(timer.loop,walk_cb,magic_cookie);
    uv_close(&timer,0);
    return;
  }
  timer_cb_cold_1();
  if (in_RSI == (uv_timer_t *)magic_cookie) {
    in_RSI = handle;
    if (handle == &timer) {
      seen_timer_handle = seen_timer_handle + 1;
      return;
    }
  }
  else {
    walk_cb_cold_1();
  }
  walk_cb_cold_2();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(in_RSI,0);
  return;
}

Assistant:

static void timer_cb(uv_timer_t* handle) {
  uv_buf_t buf = uv_buf_init("PING", 4);
  ASSERT_OK(uv_write(&write_req,
                     (uv_stream_t*) &tcp_handle,
                     &buf,
                     1,
                     write_cb));
  ASSERT_OK(uv_read_stop((uv_stream_t*) &tcp_handle));
}